

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlOutputBufferCreateFilenameFunc
xmlOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)

{
  xmlOutputBufferCreateFilenameFunc *pp_Var1;
  code *pcVar2;
  
  pp_Var1 = __xmlOutputBufferCreateFilenameValue();
  pcVar2 = *pp_Var1;
  if (pcVar2 == (xmlOutputBufferCreateFilenameFunc)0x0) {
    pcVar2 = __xmlOutputBufferCreateFilename;
  }
  pp_Var1 = __xmlOutputBufferCreateFilenameValue();
  *pp_Var1 = func;
  return pcVar2;
}

Assistant:

xmlOutputBufferCreateFilenameFunc
xmlOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)
{
    xmlOutputBufferCreateFilenameFunc old = xmlOutputBufferCreateFilenameValue;
#ifdef LIBXML_OUTPUT_ENABLED
    if (old == NULL) {
		old = __xmlOutputBufferCreateFilename;
	}
#endif
    xmlOutputBufferCreateFilenameValue = func;
    return(old);
}